

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::KeyValue::destroy
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,KeyValue *this,Path *path,
          vector<long,_std::allocator<long>_> *versions)

{
  Client *client;
  long *plVar1;
  long *plVar2;
  long *local_e0;
  long local_d8;
  long local_d0;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  Url local_c0;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  string local_80;
  _Hashtable<_ea4cb122_> local_60;
  
  if (this->version_ == v2) {
    client = this->client_;
    Vault::operator+(&local_80,"/v1",&this->mount_);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_80);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_d0 = *plVar2;
      uStack_c8 = (undefined4)plVar1[3];
      uStack_c4 = *(undefined4 *)((long)plVar1 + 0x1c);
      local_e0 = &local_d0;
    }
    else {
      local_d0 = *plVar2;
      local_e0 = (long *)*plVar1;
    }
    local_d8 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    (*client->_vptr_Client[3])(&local_c0,client,&local_e0,path);
    local_60._M_buckets = &local_60._M_single_bucket;
    local_60._M_bucket_count = 1;
    local_60._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_60._M_element_count = 0;
    local_60._M_rehash_policy._M_max_load_factor = 1.0;
    local_60._M_rehash_policy._4_4_ = 0;
    local_60._M_rehash_policy._M_next_resize = 0;
    local_60._M_single_bucket = (__node_base_ptr)0x0;
    local_a0._8_8_ = 0;
    local_88 = std::_Function_handler<$f846a34d$>::_M_invoke;
    local_90 = std::_Function_handler<$f846a34d$>::_M_manager;
    local_a0._M_unused._0_8_ = (undefined8)versions;
    HttpConsumer::post(__return_storage_ptr__,client,&local_c0,(Parameters *)&local_60,
                       (JsonProducer *)&local_a0);
    if (local_90 != (code *)0x0) {
      (*local_90)(&local_a0,&local_a0,__destroy_functor);
    }
    std::_Hashtable<$ea4cb122$>::~_Hashtable(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.value_._M_dataplus._M_p != &local_c0.value_.field_2) {
      operator_delete(local_c0.value_._M_dataplus._M_p,
                      local_c0.value_.field_2._M_allocated_capacity + 1);
    }
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::KeyValue::destroy(const Vault::Path &path,
                         std::vector<int64_t> versions) {
  if (version_ != KeyValue::Version::v2) {
    return std::nullopt;
  }

  return Vault::HttpConsumer::post(
      client_, client_.getUrl("/v1" + mount_ + "/destroy/", path), Parameters{},
      [&]([[maybe_unused]] const Parameters &params) {
        nlohmann::json j;
        j["versions"] = versions;
        return j.dump();
      });
}